

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O0

size_t absl::lts_20250127::strings_internal::EncodeUTF8Char(char *buffer,char32_t utf8_char)

{
  byte bVar1;
  char32_t utf8_char_local;
  char *buffer_local;
  
  bVar1 = (byte)utf8_char;
  if ((uint)utf8_char < 0x80) {
    *buffer = bVar1;
    buffer_local = (char *)0x1;
  }
  else if ((uint)utf8_char < 0x800) {
    buffer[1] = bVar1 & 0x3f | 0x80;
    *buffer = (byte)((uint)utf8_char >> 6) | 0xc0;
    buffer_local = (char *)0x2;
  }
  else if ((uint)utf8_char < 0x10000) {
    buffer[2] = bVar1 & 0x3f | 0x80;
    buffer[1] = (byte)((uint)utf8_char >> 6) & 0x3f | 0x80;
    *buffer = (byte)((uint)utf8_char >> 0xc) | 0xe0;
    buffer_local = (char *)0x3;
  }
  else {
    buffer[3] = bVar1 & 0x3f | 0x80;
    buffer[2] = (byte)((uint)utf8_char >> 6) & 0x3f | 0x80;
    buffer[1] = (byte)((uint)utf8_char >> 0xc) & 0x3f | 0x80;
    *buffer = (byte)((uint)utf8_char >> 0x12) | 0xf0;
    buffer_local = (char *)0x4;
  }
  return (size_t)buffer_local;
}

Assistant:

size_t EncodeUTF8Char(char *buffer, char32_t utf8_char) {
  if (utf8_char <= 0x7F) {
    *buffer = static_cast<char>(utf8_char);
    return 1;
  } else if (utf8_char <= 0x7FF) {
    buffer[1] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[0] = static_cast<char>(0xC0 | utf8_char);
    return 2;
  } else if (utf8_char <= 0xFFFF) {
    buffer[2] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[1] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[0] = static_cast<char>(0xE0 | utf8_char);
    return 3;
  } else {
    buffer[3] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[2] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[1] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[0] = static_cast<char>(0xF0 | utf8_char);
    return 4;
  }
}